

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf64.c
# Opt level: O0

void elf64_makedynamic(GlobalVars *gv,_func_uint8_t_Reloc_ptr *reloc_vlink2elf)

{
  uint8_t uVar1;
  uint uVar2;
  uint uVar3;
  LinkedSection *pLVar4;
  size_t sVar5;
  uint8_t *puVar6;
  node *pnVar7;
  long in_RDI;
  bool unaff_retaddr;
  uint8_t symtype;
  DynSymNode *dsn;
  Elf64_Sym *tab;
  Reloc *nextrel;
  Reloc *rel;
  uint8_t *pltp;
  uint8_t *dynp;
  LinkedSection *ls;
  int rela;
  bool be;
  char *fn;
  uint in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  SymTabList *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  undefined8 in_stack_ffffffffffffffb8;
  node *in_stack_ffffffffffffffc0;
  GlobalVars *in_stack_ffffffffffffffc8;
  GlobalVars *gv_00;
  Reloc *rel_00;
  char *gv_01;
  
  if (*(int *)(in_RDI + 600) != 0) {
    gv_01 = "elf64_makedynamic():";
    uVar2 = (uint)(elf_endianess == '\x01');
    uVar3 = (uint)(*(char *)(in_RDI + 0x7a) == '\x02');
    pLVar4 = find_lnksec(in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,
                         (uint8_t)((ulong)in_stack_ffffffffffffffb8 >> 0x38),
                         (uint8_t)((ulong)in_stack_ffffffffffffffb8 >> 0x30),
                         (uint8_t)((ulong)in_stack_ffffffffffffffb8 >> 0x28),
                         (uint8_t)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    if (pLVar4 == (LinkedSection *)0x0) {
      puVar6 = (uint8_t *)0x0;
    }
    else {
      puVar6 = pLVar4->data;
    }
    pLVar4 = find_lnksec(in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,
                         (uint8_t)((ulong)in_stack_ffffffffffffffb8 >> 0x38),
                         (uint8_t)((ulong)in_stack_ffffffffffffffb8 >> 0x30),
                         (uint8_t)((ulong)in_stack_ffffffffffffffb8 >> 0x28),
                         (uint8_t)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    if (pLVar4 == (LinkedSection *)0x0) {
      gv_00 = (GlobalVars *)0x0;
    }
    else {
      gv_00 = (GlobalVars *)pLVar4->data;
    }
    for (rel_00 = *(Reloc **)(in_RDI + 0x1d8); (rel_00->n).next != (node *)0x0;
        rel_00 = (Reloc *)(rel_00->n).next) {
      pnVar7 = (node *)rel_00[2].offset;
      while (in_stack_ffffffffffffffc0 = pnVar7, pnVar7 = in_stack_ffffffffffffffc0->next,
            pnVar7 != (node *)0x0) {
        if (((ulong)in_stack_ffffffffffffffc0[3].pred & 0x8000) == 0) {
          if (((ulong)in_stack_ffffffffffffffc0[3].pred & 0x4000) != 0) {
            in_stack_ffffffffffffff88 = uVar2;
            if (gv_00 == (GlobalVars *)0x0) {
              ierror("%s %s lost",gv_01,pltrel_name[(int)uVar3]);
              in_stack_ffffffffffffff88 = uVar2;
            }
            uVar2 = in_stack_ffffffffffffff88;
            sVar5 = elf64_putdynreloc((GlobalVars *)gv_01,
                                      (LinkedSection *)CONCAT44(in_stack_ffffffffffffff88,uVar3),
                                      rel_00,puVar6,(_func_uint8_t_Reloc_ptr *)gv_00,
                                      (bool)((ulong)in_stack_ffffffffffffffc0 >> 0x20),unaff_retaddr
                                     );
            gv_00 = (GlobalVars *)((long)&(gv_00->libpaths).first + sVar5);
            remnode(in_stack_ffffffffffffffc0);
          }
        }
        else {
          in_stack_ffffffffffffff88 = uVar2;
          if (puVar6 == (uint8_t *)0x0) {
            ierror("%s %s lost",gv_01,dynrel_name[(int)uVar3]);
            in_stack_ffffffffffffff88 = uVar2;
          }
          uVar2 = in_stack_ffffffffffffff88;
          sVar5 = elf64_putdynreloc((GlobalVars *)gv_01,
                                    (LinkedSection *)CONCAT44(in_stack_ffffffffffffff88,uVar3),
                                    rel_00,puVar6,(_func_uint8_t_Reloc_ptr *)gv_00,
                                    (bool)((ulong)in_stack_ffffffffffffffc0 >> 0x20),unaff_retaddr);
          puVar6 = puVar6 + sVar5;
          remnode(in_stack_ffffffffffffffc0);
        }
      }
      in_stack_ffffffffffffffb8 = 0;
    }
    pLVar4 = find_lnksec(gv_00,(char *)in_stack_ffffffffffffffc0,
                         (uint8_t)((ulong)in_stack_ffffffffffffffb8 >> 0x38),
                         (uint8_t)((ulong)in_stack_ffffffffffffffb8 >> 0x30),
                         (uint8_t)((ulong)in_stack_ffffffffffffffb8 >> 0x28),
                         (uint8_t)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    if (pLVar4 == (LinkedSection *)0x0) {
      ierror("%s %s lost",gv_01,".dynsym");
    }
    else {
      puVar6 = pLVar4->data;
      elf_putsymtab((uint8_t *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                    in_stack_ffffffffffffff98);
      while (pnVar7 = remhead(&elfdynsymlist), pnVar7 != (node *)0x0) {
        uVar1 = elf_getinfo((Symbol *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90))
        ;
        write64(in_stack_ffffffffffffff94,
                (void *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),0x134f9e);
        in_stack_ffffffffffffff94 = uVar2;
        uVar2 = in_stack_ffffffffffffff94;
        elf_getshndx((GlobalVars *)CONCAT17(uVar1,in_stack_ffffffffffffffa0),
                     (Symbol *)(puVar6 + (ulong)*(uint *)&pnVar7[1].pred * 0x18 + 6),
                     (uint8_t)(in_stack_ffffffffffffff94 >> 0x18));
        write16(in_stack_ffffffffffffff94,
                (void *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),0);
      }
    }
  }
  return;
}

Assistant:

static void elf64_makedynamic(struct GlobalVars *gv,
                              uint8_t (*reloc_vlink2elf)(struct Reloc *))
{
  if (gv->dynamic) {
    const char *fn = "elf64_makedynamic():";
    bool be = elf_endianess == _BIG_ENDIAN_;
    int rela = gv->reloctab_format==RTAB_ADDEND ? 1 : 0;
    struct LinkedSection *ls;
    uint8_t *dynp,*pltp;

    if (ls = find_lnksec(gv,dynrel_name[rela],0,0,0,0))
      dynp = ls->data;
    else
      dynp = NULL;
    if (ls = find_lnksec(gv,pltrel_name[rela],0,0,0,0))
      pltp = ls->data;
    else
      pltp = NULL;

    /* write dynamic relocations */
    for (ls=(struct LinkedSection *)gv->lnksec.first;
         ls->n.next!=NULL; ls=(struct LinkedSection *)ls->n.next) {
      struct Reloc *rel = (struct Reloc *)ls->xrefs.first;
      struct Reloc *nextrel;

      while (nextrel = (struct Reloc *)rel->n.next) {
        if (rel->flags & RELF_DYN) {
          if (dynp == NULL)
            ierror("%s %s lost",fn,dynrel_name[rela]);
          dynp += elf64_putdynreloc(gv,ls,rel,dynp,reloc_vlink2elf,rela,be);
          remnode(&rel->n);
          /* free rel */
        }
        else if (rel->flags & RELF_PLT) {
          if (pltp == NULL)
            ierror("%s %s lost",fn,pltrel_name[rela]);
          pltp += elf64_putdynreloc(gv,ls,rel,pltp,reloc_vlink2elf,rela,be);
          remnode(&rel->n);
          /* free rel */
        }
        rel = nextrel;
      }
    }

    /* write dynamic symbols to .dynsym and fix their values */
    if (ls = find_lnksec(gv,dynsym_name,0,0,0,0)) {
      struct Elf64_Sym *tab = (struct Elf64_Sym *)ls->data;
      struct DynSymNode *dsn;

      elf_putsymtab(ls->data,&elfdsymlist);
      while (dsn = (struct DynSymNode *)remhead(&elfdynsymlist)) {
        uint8_t symtype = elf_getinfo(dsn->sym);

        write64(be,tab[dsn->idx].st_value,dsn->sym->value);
        write16(be,tab[dsn->idx].st_shndx,elf_getshndx(gv,dsn->sym,symtype));
        /* free dsn? */
      }
    }
    else
      ierror("%s %s lost",fn,dynsym_name);
  }
}